

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

uint __thiscall
Strings::VerySimpleReadOnlyString::Find
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *needle,uint pos)

{
  uint local_28;
  uint local_24;
  uint j;
  uint pos_local;
  VerySimpleReadOnlyString *needle_local;
  VerySimpleReadOnlyString *this_local;
  
  local_28 = 0;
  local_24 = pos;
  do {
    while( true ) {
      if ((uint)this->length <= local_24 + local_28) {
        return this->length;
      }
      if (needle->data[local_28] == this->data[local_24 + local_28]) break;
      local_24 = local_24 + 1;
      local_28 = 0;
    }
    local_28 = local_28 + 1;
  } while (local_28 != needle->length);
  return local_24;
}

Assistant:

const unsigned int VerySimpleReadOnlyString::Find(const VerySimpleReadOnlyString & needle, unsigned int pos) const
    {
	    for (unsigned int j = 0; pos + j < (unsigned int)length;)
	    {
		    if (needle.data[j] == data[pos + j])
		    {
			    j++;
			    if (j == (unsigned int)needle.length)	return pos;
			    continue;
		    }
		    pos++;
		    j = 0;
	    }
        return (unsigned int)length;
    }